

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_ObjCollectInternal_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if ((iVar1 != 0) && ((*(ulong *)pObj >> 0x1e & 1) == 0)) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | 0x40000000;
    pGVar2 = Gia_ObjFanin0(pObj);
    Gia_ObjCollectInternal_rec(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Gia_ObjCollectInternal_rec(p,pGVar2);
    iVar1 = Vec_IntSize(p->vTtNodes);
    Gia_ObjSetNum(p,pObj,iVar1);
    p_00 = p->vTtNodes;
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(p_00,iVar1);
  }
  return;
}

Assistant:

void Gia_ObjCollectInternal_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    Gia_ObjCollectInternal_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ObjCollectInternal_rec( p, Gia_ObjFanin1(pObj) );
    Gia_ObjSetNum( p, pObj, Vec_IntSize(p->vTtNodes) );
    Vec_IntPush( p->vTtNodes, Gia_ObjId(p, pObj) );
}